

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_clear(nk_font_atlas *atlas)

{
  nk_font_config *pnVar1;
  nk_font *pnVar2;
  nk_font *next_1;
  nk_font *iter_1;
  nk_font_config *n;
  nk_font_config *i;
  nk_font_config *next;
  nk_font_config *iter;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3647,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3648,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3649,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x364a,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x364b,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if (((atlas != (nk_font_atlas *)0x0) && ((atlas->permanent).alloc != (nk_plugin_alloc)0x0)) &&
     ((atlas->permanent).free != (nk_plugin_free)0x0)) {
    if (atlas->config != (nk_font_config *)0x0) {
      next = atlas->config;
      while (next != (nk_font_config *)0x0) {
        n = next->n;
        while (n != next) {
          pnVar1 = n->n;
          if (n->ttf_blob != (void *)0x0) {
            (*(atlas->permanent).free)((atlas->permanent).userdata,n->ttf_blob);
          }
          (*(atlas->permanent).free)((atlas->permanent).userdata,n);
          n = pnVar1;
        }
        pnVar1 = next->next;
        if (n->ttf_blob != (void *)0x0) {
          (*(atlas->permanent).free)((atlas->permanent).userdata,next->ttf_blob);
        }
        (*(atlas->permanent).free)((atlas->permanent).userdata,next);
        next = pnVar1;
      }
      atlas->config = (nk_font_config *)0x0;
    }
    if (atlas->fonts != (nk_font *)0x0) {
      next_1 = atlas->fonts;
      while (next_1 != (nk_font *)0x0) {
        pnVar2 = next_1->next;
        (*(atlas->permanent).free)((atlas->permanent).userdata,next_1);
        next_1 = pnVar2;
      }
      atlas->fonts = (nk_font *)0x0;
    }
    if (atlas->glyphs != (nk_font_glyph *)0x0) {
      (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
    }
    nk_zero(atlas,400);
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_clear(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;

    if (atlas->config) {
        struct nk_font_config *iter, *next;
        for (iter = atlas->config; iter; iter = next) {
            struct nk_font_config *i, *n;
            for (i = iter->n; i != iter; i = n) {
                n = i->n;
                if (i->ttf_blob)
                    atlas->permanent.free(atlas->permanent.userdata, i->ttf_blob);
                atlas->permanent.free(atlas->permanent.userdata, i);
            }
            next = iter->next;
            if (i->ttf_blob)
                atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
        atlas->config = 0;
    }
    if (atlas->fonts) {
        struct nk_font *iter, *next;
        for (iter = atlas->fonts; iter; iter = next) {
            next = iter->next;
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
        atlas->fonts = 0;
    }
    if (atlas->glyphs)
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
    nk_zero_struct(*atlas);
}